

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::UdpOutputPortDeclSyntax::setChild
          (UdpOutputPortDeclSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_0048ea04 + *(int *)(&DAT_0048ea04 + index * 4)))();
  return;
}

Assistant:

void UdpOutputPortDeclSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: keyword = child.token(); return;
        case 2: reg = child.token(); return;
        case 3: name = child.token(); return;
        case 4: initializer = child.node() ? &child.node()->as<EqualsValueClauseSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}